

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLVariant::Format(ON_XMLVariant *this,ON_wString *sOut)

{
  int iVar1;
  uint uVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  ON_wString sType;
  ON_wString local_40;
  ON_wString local_38;
  
  ON_wString::ON_wString(&local_40);
  switch(this->_private->_type) {
  case Null:
    ON_wString::operator=(sOut,"[null]");
    goto LAB_0067c12b;
  case Bool:
    pwVar3 = L"Bool";
    break;
  case Integer:
    pwVar3 = L"Integer";
    break;
  case Float:
    pwVar3 = L"Float";
    break;
  case Double:
    pwVar3 = L"Double";
    break;
  case String:
    pwVar3 = L"String";
    break;
  case DoubleArray2:
    pwVar3 = L"DoubleArray2";
    break;
  case DoubleArray3:
    pwVar3 = L"DoubleArray3";
    break;
  case DoubleArray4:
    pwVar3 = L"DoubleArray4";
    break;
  case DoubleColor4:
    pwVar3 = L"DoubleColor4";
    break;
  case Matrix:
    pwVar3 = L"Matrix";
    break;
  case Uuid:
    pwVar3 = L"UUID";
    break;
  case Time:
    pwVar3 = L"Time";
    break;
  case Buffer:
    pwVar3 = L"Buffer";
    break;
  default:
    goto switchD_0067c024_default;
  }
  ON_wString::operator=(&local_40,pwVar3);
switchD_0067c024_default:
  pwVar3 = ON_wString::Array(&local_40);
  (*this->_vptr_ON_XMLVariant[0x2d])(&local_38,this);
  pwVar4 = ON_wString::Array(&local_38);
  iVar1 = (*this->_vptr_ON_XMLVariant[9])(this);
  uVar2 = (*this->_vptr_ON_XMLVariant[2])(this,0);
  pwVar5 = StringFromUnits((LengthUnitSystem)iVar1);
  ON_wString::Format(sOut,L"Type=%s, Value=%s, Units=%s, CRC=%08X",pwVar3,pwVar4,pwVar5,(ulong)uVar2
                    );
  ON_wString::~ON_wString(&local_38);
LAB_0067c12b:
  ON_wString::~ON_wString(&local_40);
  return;
}

Assistant:

void ON_XMLVariant::Format(ON_wString& sOut) const
{
  ON_wString sType;

  switch (_private->_type)
  {
  case Types::Null:
    sOut = "[null]";
    return;

  case Types::Bool:
    sType = L"Bool";
    break;

  case Types::Float:
    sType = L"Float";
    break;

  case Types::Double:
    sType = L"Double";
    break;

  case Types::Integer:
    sType = L"Integer";
    break;

  case Types::DoubleColor4:
    sType = L"DoubleColor4";
    break;

  case Types::DoubleArray2:
    sType = L"DoubleArray2";
    break;

  case Types::DoubleArray3:
    sType = L"DoubleArray3";
    break;

  case Types::DoubleArray4:
    sType = L"DoubleArray4";
    break;

  case Types::String:
    sType = L"String";
    break;

  case Types::Uuid:
    sType = L"UUID";
    break;

  case Types::Matrix:
    sType = L"Matrix";
    break;

  case Types::Time:
    sType = L"Time";
    break;

  case Types::Buffer:
    sType = L"Buffer";
    break;
  }

  sOut.Format(L"Type=%s, Value=%s, Units=%s, CRC=%08X",
              sType.Array(), AsString().Array(), StringFromUnits(Units()), DataCRC(0));
}